

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::combineDataTypes
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          bool enumerating,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataTypes,CommandFlavourFlags flavourFlags,bool raii)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  pointer pcVar3;
  size_t sVar4;
  _Rb_tree_node_base *p_Var5;
  size_type __n;
  byte bVar6;
  int iVar7;
  _Base_ptr p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  _Base_ptr p_Var10;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  _Base_ptr p_Var15;
  byte bVar16;
  pointer puVar17;
  size_type __n_00;
  undefined8 uVar18;
  _Base_ptr p_Var19;
  string *this_00;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modifiedDataTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  *local_160;
  string *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  long *local_b8;
  size_type local_b0;
  long local_a8 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n_00 = (long)(dataTypes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(dataTypes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (__n_00 != (long)(returnParams->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(returnParams->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) {
    __assert_fail("dataTypes.size() == returnParams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x585,
                  "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                 );
  }
  local_158 = __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__n_00,(allocator_type *)&local_1e0);
  puVar17 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_160 = vectorParams;
  if ((returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar17) {
    p_Var1 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
    bVar6 = (flavourFlags.m_mask & 8) >> 3 | raii;
    paVar14 = &local_130.field_2;
    uVar20 = 0;
    local_98 = returnParams;
    do {
      p_Var10 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 = &p_Var1->_M_header;
      if (p_Var10 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var10 + 1) >= puVar17[uVar20]) {
            p_Var8 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < puVar17[uVar20]];
        } while (p_Var10 != (_Base_ptr)0x0);
      }
      p_Var10 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
         (p_Var10 = p_Var8, puVar17[uVar20] < *(ulong *)(p_Var8 + 1))) {
        p_Var10 = &p_Var1->_M_header;
      }
      bVar21 = (flavourFlags.m_mask & 4) != 0;
      bVar22 = (_Rb_tree_header *)p_Var10 == p_Var1;
      if (bVar22 || bVar21) {
        pbVar2 = (dataTypes->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        pcVar3 = pbVar2[uVar20]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,pcVar3,pcVar3 + pbVar2[uVar20]._M_string_length);
        bVar16 = 0;
      }
      else {
        std::operator+(&local_d8,"std::vector<",
                       (dataTypes->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar20);
        if (bVar6 == 0) {
          pbVar2 = (dataTypes->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"VULKAN_HPP_NAMESPACE::","");
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          pcVar3 = pbVar2[uVar20]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,pcVar3,pcVar3 + pbVar2[uVar20]._M_string_length);
          __n = local_b0;
          if ((local_b0 <= local_150._M_string_length) &&
             ((local_b0 == 0 ||
              (iVar7 = bcmp(local_150._M_dataplus._M_p,local_b8,local_b0), iVar7 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_150,0,__n);
          }
          anon_unknown.dwarf_1900a8::startUpperCase(&local_70,&local_150);
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_70,0,0,", ",2);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar9->_M_dataplus)._M_p;
          paVar12 = &pbVar9->field_2;
          if (paVar13 == paVar12) {
            local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          }
          else {
            local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_f8._M_dataplus._M_p = (pointer)paVar13;
          }
          local_f8._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_f8,"Allocator>");
          local_130._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
          paVar13 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p == paVar13) {
            local_130.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_130.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_130._M_dataplus._M_p = (pointer)paVar14;
          }
          else {
            local_130.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_130._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar13;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
        }
        else {
          local_130._M_dataplus._M_p = (pointer)paVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,">","");
        }
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar18 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_130._M_string_length + local_d8._M_string_length) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar14) {
            uVar18 = local_130.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_130._M_string_length + local_d8._M_string_length)
          goto LAB_0013ac1b;
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_130,0,0,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        }
        else {
LAB_0013ac1b:
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_d8,local_130._M_dataplus._M_p,local_130._M_string_length);
        }
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar9->_M_dataplus)._M_p;
        paVar13 = &pbVar9->field_2;
        if (paVar12 == paVar13) {
          local_1e0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_1e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        }
        else {
          local_1e0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_1e0._M_dataplus._M_p = (pointer)paVar12;
        }
        local_1e0._M_string_length = pbVar9->_M_string_length;
        (pbVar9->_M_dataplus)._M_p = (pointer)paVar13;
        pbVar9->_M_string_length = 0;
        paVar13->_M_local_buf[0] = '\0';
        bVar16 = bVar6 ^ 1;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (local_110.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar20,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar22 && !bVar21) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar14)) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      vectorParams = local_160;
      if (bVar16 != 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8,local_a8[0] + 1);
        }
      }
      if ((!bVar22 && !bVar21) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2)) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      uVar20 = uVar20 + 1;
      puVar17 = (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(local_98->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar17 >> 3
                             ));
  }
  pbVar2 = local_110.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = local_158;
  (local_158->_M_dataplus)._M_p = (pointer)&local_158->field_2;
  local_158->_M_string_length = 0;
  (local_158->field_2)._M_local_buf[0] = '\0';
  switch((long)local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5) {
  case 0:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (local_158,0,0,"void",4);
    goto LAB_0013ae5b;
  case 1:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (local_158,
               local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    goto LAB_0013ae5b;
  case 2:
    if (enumerating) {
      p_Var10 = (local_160->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var19 = &(local_160->_M_t)._M_impl.super__Rb_tree_header._M_header;
      p_Var8 = p_Var19;
      if (p_Var10 != (_Base_ptr)0x0) {
        p_Var15 = p_Var10;
        do {
          if (*(ulong *)(p_Var15 + 1) >= puVar17[1]) {
            p_Var8 = p_Var15;
          }
          p_Var15 = (&p_Var15->_M_left)[*(ulong *)(p_Var15 + 1) < puVar17[1]];
        } while (p_Var15 != (_Base_ptr)0x0);
      }
      p_Var15 = p_Var19;
      if ((p_Var8 != p_Var19) && (p_Var15 = p_Var8, puVar17[1] < *(ulong *)(p_Var8 + 1))) {
        p_Var15 = p_Var19;
      }
      if (p_Var15 == p_Var19) {
LAB_0013b70c:
        __assert_fail("!enumerating || ( vectorParams.contains( returnParams[1] ) && ( vectorParams.find( returnParams[1] )->second.lenParam == returnParams[0] ) )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x599,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      p_Var8 = p_Var19;
      if (p_Var10 != (_Base_ptr)0x0) {
        do {
          if (*(ulong *)(p_Var10 + 1) >= puVar17[1]) {
            p_Var8 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < puVar17[1]];
        } while (p_Var10 != (_Base_ptr)0x0);
      }
      if ((p_Var8 != p_Var19) && (*(ulong *)(p_Var8 + 1) <= puVar17[1])) {
        p_Var19 = p_Var8;
      }
      if (p_Var19[1]._M_parent != (_Base_ptr)*puVar17) goto LAB_0013b70c;
      if (!enumerating) goto LAB_0013afe3;
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      pcVar3 = local_110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,pcVar3,
                 pcVar3 + local_110.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    }
    else {
LAB_0013afe3:
      std::operator+(&local_180,"std::pair<",
                     local_110.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_180,", ");
      local_1c0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p == paVar14) {
        local_1c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_1c0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_1c0,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
      local_1a0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p == paVar14) {
        local_1a0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_1a0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_1a0,">");
      combineDataTypes();
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (enumerating) goto LAB_0013ae5b;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
LAB_0013b678:
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
LAB_0013b685:
    local_50.field_2._M_allocated_capacity = local_180.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_180._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p == &local_180.field_2) goto LAB_0013ae5b;
    break;
  case 3:
    sVar4 = (local_160->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar4 == 2) {
      if (!enumerating) {
        __assert_fail("enumerating",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a9,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      p_Var5 = (local_160->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((((*(unsigned_long *)(p_Var5 + 1) != puVar17[1]) ||
           (p_Var10 = (_Base_ptr)*puVar17, p_Var5[1]._M_parent != p_Var10)) ||
          (lVar11 = std::_Rb_tree_increment(p_Var5), *(unsigned_long *)(lVar11 + 0x20) != puVar17[2]
          )) || (lVar11 = std::_Rb_tree_increment(p_Var5), *(_Base_ptr *)(lVar11 + 0x28) != p_Var10)
         ) {
        __assert_fail("( vectorParams.begin()->first == returnParams[1] ) && ( vectorParams.begin()->second.lenParam == returnParams[0] ) && ( std::next( vectorParams.begin() )->first == returnParams[2] ) && ( std::next( vectorParams.begin() )->second.lenParam == returnParams[0] )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5ac,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      std::operator+(&local_180,"std::pair<",pbVar2 + 1);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_180,", ");
      local_1c0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p == paVar14) {
        local_1c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_1c0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_1c0,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
      local_1a0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p == paVar14) {
        local_1a0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_1a0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1a0,">");
LAB_0013b5ed:
      local_1e0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p == paVar14) {
        local_1e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_1e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      }
      else {
        local_1e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_1e0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (this_00,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) goto LAB_0013b678;
      goto LAB_0013b685;
    }
    if (sVar4 == 1) {
      if (!enumerating) {
        __assert_fail("enumerating",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a4,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      p_Var10 = (local_160->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((*(unsigned_long *)(p_Var10 + 1) != puVar17[2]) ||
         (p_Var10[1]._M_parent != (_Base_ptr)puVar17[1])) {
        __assert_fail("( vectorParams.begin()->first == returnParams[2] ) && ( vectorParams.begin()->second.lenParam == returnParams[1] )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x5a5,
                      "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                     );
      }
      std::operator+(&local_180,"std::pair<",
                     local_110.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_180,", ");
      local_1c0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p == paVar14) {
        local_1c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_1c0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_1c0,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,
                         local_110.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
      local_1a0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar14 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p == paVar14) {
        local_1a0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_1a0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1a0,">");
      goto LAB_0013b5ed;
    }
    if (sVar4 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x5af,
                    "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                   );
    }
    if (enumerating) {
      __assert_fail("!enumerating",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x5a0,
                    "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                   );
    }
    std::operator+(&local_50,"std::tuple<",
                   local_110.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_50,", ");
    local_90._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
    paVar14 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar14) {
      local_90.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_90,
                       local_110.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                       local_110.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
    local_180._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
    paVar14 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p == paVar14) {
      local_180.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_180.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    }
    else {
      local_180.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_180._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_180,", ");
    local_1c0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
    paVar14 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == paVar14) {
      local_1c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_1c0._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1c0,
                       local_110.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,
                       local_110.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
    local_1a0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
    paVar14 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p == paVar14) {
      local_1a0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_1a0._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1a0,">");
    local_1e0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
    paVar14 = &pbVar9->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p == paVar14) {
      local_1e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    }
    else {
      local_1e0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_1e0._M_string_length = pbVar9->_M_string_length;
    (pbVar9->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar9->_M_string_length = 0;
    (pbVar9->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (local_158,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_158;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0013ae5b;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x5b2,
                  "std::string VulkanHppGenerator::combineDataTypes(const std::map<size_t, VectorParamData> &, const std::vector<size_t> &, bool, const std::vector<std::string> &, CommandFlavourFlags, bool) const"
                 );
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_0013ae5b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
  return this_00;
}

Assistant:

std::string VulkanHppGenerator::combineDataTypes( std::map<size_t, VectorParamData> const & vectorParams,
                                                  std::vector<size_t> const &               returnParams,
                                                  bool                                      enumerating,
                                                  std::vector<std::string> const &          dataTypes,
                                                  CommandFlavourFlags                       flavourFlags,
                                                  bool                                      raii ) const
{
  assert( dataTypes.size() == returnParams.size() );

  std::vector<std::string> modifiedDataTypes( dataTypes.size() );
  for ( size_t i = 0; i < returnParams.size(); ++i )
  {
    auto vectorParamIt   = vectorParams.find( returnParams[i] );
    modifiedDataTypes[i] = ( vectorParamIt == vectorParams.end() || ( flavourFlags & CommandFlavourFlagBits::singular ) )
                           ? dataTypes[i]
                           : ( "std::vector<" + dataTypes[i] +
                               ( raii || ( flavourFlags & CommandFlavourFlagBits::unique )
                                   ? ">"
                                   : ( ", " + startUpperCase( stripPrefix( dataTypes[i], "VULKAN_HPP_NAMESPACE::" ) ) + "Allocator>" ) ) );
  }

  std::string combinedType;
  switch ( modifiedDataTypes.size() )
  {
    case 0: combinedType = "void"; break;
    case 1: combinedType = modifiedDataTypes[0]; break;
    case 2:
      assert( !enumerating || ( vectorParams.contains( returnParams[1] ) && ( vectorParams.find( returnParams[1] )->second.lenParam == returnParams[0] ) ) );
      combinedType = enumerating ? modifiedDataTypes[1] : ( "std::pair<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[1] + ">" );
      break;
    case 3:
      switch ( vectorParams.size() )
      {
        case 0:
          assert( !enumerating );
          combinedType = "std::tuple<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[1] + ", " + modifiedDataTypes[2] + ">";
          break;
        case 1:
          assert( enumerating );
          assert( ( vectorParams.begin()->first == returnParams[2] ) && ( vectorParams.begin()->second.lenParam == returnParams[1] ) );
          combinedType = "std::pair<" + modifiedDataTypes[0] + ", " + modifiedDataTypes[2] + ">";
          break;
        case 2:
          assert( enumerating );
          assert( ( vectorParams.begin()->first == returnParams[1] ) && ( vectorParams.begin()->second.lenParam == returnParams[0] ) &&
                  ( std::next( vectorParams.begin() )->first == returnParams[2] ) &&
                  ( std::next( vectorParams.begin() )->second.lenParam == returnParams[0] ) );
          combinedType = "std::pair<" + modifiedDataTypes[1] + ", " + modifiedDataTypes[2] + ">";
          break;
        default: assert( false ); break;
      }
      break;
    default: assert( false ); break;
  }
  return combinedType;
}